

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_freelist_save(MDB_txn *txn)

{
  uint uVar1;
  long *plVar2;
  MDB_ID MVar3;
  int iVar4;
  long lVar5;
  MDB_IDL ids;
  MDB_page *local_2b8;
  pgno_t local_2a8;
  long local_2a0;
  MDB_ID save;
  ssize_t len;
  txnid_t id;
  MDB_val data_1;
  MDB_val key_1;
  MDB_IDL loose;
  MDB_ID *pMStack_250;
  uint count;
  MDB_page *mp_1;
  ssize_t j;
  pgno_t *pgs;
  MDB_val data;
  MDB_val key;
  MDB_ID xlen;
  MDB_ID *xidl;
  MDB_page *mp;
  ssize_t clean_limit;
  ssize_t mop_len;
  ssize_t total_room;
  ssize_t head_room;
  pgno_t *mop;
  pgno_t *free_pgs;
  pgno_t freecnt;
  txnid_t head_id;
  txnid_t pglast;
  int local_1b0;
  int more;
  int maxfree_1pg;
  int rc;
  MDB_env *env;
  MDB_cursor mc;
  MDB_txn *txn_local;
  
  _maxfree_1pg = txn->mt_env;
  local_1b0 = _maxfree_1pg->me_maxfree_1pg;
  pglast._4_4_ = 1;
  head_id = 0;
  freecnt = 0;
  free_pgs = (pgno_t *)0x0;
  total_room = 0;
  mop_len = 0;
  mc.mc_ki._56_8_ = txn;
  mdb_cursor_init((MDB_cursor *)&env,txn,0,(MDB_xcursor *)0x0);
  if ((((_maxfree_1pg->me_pgstate).mf_pghead != (pgno_t *)0x0) &&
      (more = mdb_page_search((MDB_cursor *)&env,(MDB_val *)0x0,5), more != 0)) && (more != -0x784e)
     ) {
    return more;
  }
  if (((_maxfree_1pg->me_pgstate).mf_pghead == (pgno_t *)0x0) &&
     (*(long *)(mc.mc_ki._56_8_ + 0x30) != 0)) {
    xidl = *(MDB_ID **)(mc.mc_ki._56_8_ + 0x30);
    iVar4 = mdb_midl_need((MDB_IDL *)(mc.mc_ki._56_8_ + 0x28),*(uint *)(mc.mc_ki._56_8_ + 0x38));
    if (iVar4 != 0) {
      return iVar4;
    }
    for (; xidl != (MDB_ID *)0x0; xidl = (MDB_ID *)xidl[6]) {
      plVar2 = *(long **)(mc.mc_ki._56_8_ + 0x28);
      lVar5 = *plVar2;
      *plVar2 = lVar5 + 1;
      plVar2[lVar5 + 1] = *xidl;
    }
    *(undefined8 *)(mc.mc_ki._56_8_ + 0x30) = 0;
    *(undefined4 *)(mc.mc_ki._56_8_ + 0x38) = 0;
    more = 0;
  }
  if ((_maxfree_1pg->me_flags & 0x1080000) == 0) {
    local_2a0 = (long)local_1b0;
  }
  else {
    local_2a0 = 0x7fffffffffffffff;
  }
  while( true ) {
    while ((_maxfree_1pg->me_pgstate).mf_pglast <= head_id) {
      if (free_pgs < (pgno_t *)**(ulong **)(mc.mc_ki._56_8_ + 0x28)) {
        if (((free_pgs == (pgno_t *)0x0) &&
            (more = mdb_page_search((MDB_cursor *)&env,(MDB_val *)0x0,9), more != 0)) &&
           (more != -0x784e)) {
          return more;
        }
        mop = *(pgno_t **)(mc.mc_ki._56_8_ + 0x28);
        data.mv_data = (void *)0x8;
        key.mv_size = mc.mc_ki._56_8_ + 0x18;
        do {
          free_pgs = (pgno_t *)*mop;
          pgs = (pgno_t *)((*mop + 1) * 8);
          more = mdb_cursor_put((MDB_cursor *)&env,(MDB_val *)&data.mv_data,(MDB_val *)&pgs,0x10000)
          ;
          if (more != 0) {
            return more;
          }
          mop = *(pgno_t **)(mc.mc_ki._56_8_ + 0x28);
        } while (free_pgs < (pgno_t *)*mop);
        mdb_midl_sort(mop);
        memcpy((void *)data.mv_size,mop,(size_t)pgs);
      }
      else {
        head_room = (ssize_t)(_maxfree_1pg->me_pgstate).mf_pghead;
        if ((pgno_t *)head_room == (pgno_t *)0x0) {
          local_2a8 = 0;
        }
        else {
          local_2a8 = *(pgno_t *)head_room;
        }
        clean_limit = local_2a8 + (long)*(int *)(mc.mc_ki._56_8_ + 0x38);
        if (mop_len < clean_limit) {
          if ((local_1b0 <= total_room) && (1 < freecnt)) {
            freecnt = freecnt - 1;
            total_room = 0;
          }
        }
        else if ((mop_len == clean_limit) || (pglast._4_4_ = pglast._4_4_ + -1, pglast._4_4_ < 0)) {
          if (*(long *)(mc.mc_ki._56_8_ + 0x30) != 0) {
            pMStack_250 = *(MDB_ID **)(mc.mc_ki._56_8_ + 0x30);
            uVar1 = *(uint *)(mc.mc_ki._56_8_ + 0x38);
            more = mdb_midl_need(&(_maxfree_1pg->me_pgstate).mf_pghead,uVar1 * 2 + 1);
            if (more != 0) {
              return more;
            }
            head_room = (ssize_t)(_maxfree_1pg->me_pgstate).mf_pghead;
            ids = (MDB_IDL)(head_room + (*(MDB_IDL)(head_room + -8) - (ulong)uVar1) * 8);
            loose._4_4_ = 0;
            for (; pMStack_250 != (MDB_ID *)0x0; pMStack_250 = (MDB_ID *)pMStack_250[6]) {
              loose._4_4_ = loose._4_4_ + 1;
              ids[loose._4_4_] = *pMStack_250;
            }
            *ids = (ulong)loose._4_4_;
            mdb_midl_sort(ids);
            mdb_midl_xmerge((MDB_IDL)head_room,ids);
            *(undefined8 *)(mc.mc_ki._56_8_ + 0x30) = 0;
            *(undefined4 *)(mc.mc_ki._56_8_ + 0x38) = 0;
            clean_limit = *(ssize_t *)head_room;
          }
          more = 0;
          if (clean_limit != 0) {
            head_room = clean_limit * 8 + head_room;
            more = mdb_cursor_first((MDB_cursor *)&env,(MDB_val *)&data_1.mv_data,(MDB_val *)&id);
            while (more == 0) {
              len = *(ssize_t *)key_1.mv_size;
              save = (id >> 3) - 1;
              if (((long)save < 0) || ((_maxfree_1pg->me_pgstate).mf_pglast < (ulong)len)) {
                mdb_assert_fail(*(MDB_env **)(mc.mc_ki._56_8_ + 0x20),
                                "len >= 0 && id <= env->me_pglast","mdb_freelist_save",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                                ,0xd82);
              }
              key_1.mv_size = (size_t)&len;
              if (clean_limit < (long)save) {
                save = clean_limit;
                id = (clean_limit + 1) * 8;
              }
              head_room = head_room + save * -8;
              MVar3 = *(MDB_ID *)head_room;
              *(MDB_ID *)head_room = save;
              data_1.mv_size = head_room;
              more = mdb_cursor_put((MDB_cursor *)&env,(MDB_val *)&data_1.mv_data,(MDB_val *)&id,
                                    0x40);
              *(MDB_ID *)head_room = MVar3;
              if (more != 0) {
                return more;
              }
              clean_limit = clean_limit - save;
              if (clean_limit == 0) {
                return 0;
              }
              more = mdb_cursor_next((MDB_cursor *)&env,(MDB_val *)&data_1.mv_data,(MDB_val *)&id,
                                     MDB_NEXT);
            }
          }
          return more;
        }
        lVar5 = mop_len - total_room;
        total_room = clean_limit - lVar5;
        if ((local_1b0 < total_room) && (1 < freecnt)) {
          total_room = ((long)local_1b0 -
                       (long)((ulong)total_room / freecnt) % (long)(local_1b0 + 1)) +
                       (ulong)total_room / freecnt;
        }
        else if (total_room < 0) {
          total_room = 0;
        }
        data.mv_data = (void *)0x8;
        key.mv_size = (size_t)&freecnt;
        pgs = (pgno_t *)((total_room + 1) * 8);
        iVar4 = mdb_cursor_put((MDB_cursor *)&env,(MDB_val *)&data.mv_data,(MDB_val *)&pgs,0x10000);
        if (iVar4 != 0) {
          return iVar4;
        }
        if (local_2a0 < total_room) {
          local_2b8 = (MDB_page *)total_room;
        }
        else {
          local_2b8 = (MDB_page *)0x0;
        }
        mp_1 = local_2b8;
        do {
          *(undefined8 *)(data.mv_size + (long)mp_1 * 8) = 0;
          mp_1 = (MDB_page *)&mp_1[-1].field_0x17;
        } while (-1 < (long)mp_1);
        mop_len = total_room + lVar5;
        more = 0;
      }
    }
    more = mdb_cursor_first((MDB_cursor *)&env,(MDB_val *)&data.mv_data,(MDB_val *)0x0);
    if (more != 0) {
      return more;
    }
    freecnt = *(pgno_t *)key.mv_size;
    total_room = 0;
    mop_len = 0;
    head_id = freecnt;
    if ((_maxfree_1pg->me_pgstate).mf_pglast < freecnt) {
      mdb_assert_fail(*(MDB_env **)(mc.mc_ki._56_8_ + 0x20),"pglast <= env->me_pglast",
                      "mdb_freelist_save",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/moneroexamples[P]lmdbcpp-test/ext/liblmdb/mdb.c"
                      ,0xd0e);
    }
    iVar4 = mdb_cursor_del((MDB_cursor *)&env,0);
    if (iVar4 != 0) break;
    more = 0;
  }
  return iVar4;
}

Assistant:

static int
mdb_freelist_save(MDB_txn *txn)
{
	/* env->me_pghead[] can grow and shrink during this call.
	 * env->me_pglast and txn->mt_free_pgs[] can only grow.
	 * Page numbers cannot disappear from txn->mt_free_pgs[].
	 */
	MDB_cursor mc;
	MDB_env	*env = txn->mt_env;
	int rc, maxfree_1pg = env->me_maxfree_1pg, more = 1;
	txnid_t	pglast = 0, head_id = 0;
	pgno_t	freecnt = 0, *free_pgs, *mop;
	ssize_t	head_room = 0, total_room = 0, mop_len, clean_limit;

	mdb_cursor_init(&mc, txn, FREE_DBI, NULL);

	if (env->me_pghead) {
		/* Make sure first page of freeDB is touched and on freelist */
		rc = mdb_page_search(&mc, NULL, MDB_PS_FIRST|MDB_PS_MODIFY);
		if (rc && rc != MDB_NOTFOUND)
			return rc;
	}

	if (!env->me_pghead && txn->mt_loose_pgs) {
		/* Put loose page numbers in mt_free_pgs, since
		 * we may be unable to return them to me_pghead.
		 */
		MDB_page *mp = txn->mt_loose_pgs;
		if ((rc = mdb_midl_need(&txn->mt_free_pgs, txn->mt_loose_count)) != 0)
			return rc;
		for (; mp; mp = NEXT_LOOSE_PAGE(mp))
			mdb_midl_xappend(txn->mt_free_pgs, mp->mp_pgno);
		txn->mt_loose_pgs = NULL;
		txn->mt_loose_count = 0;
	}

	/* MDB_RESERVE cancels meminit in ovpage malloc (when no WRITEMAP) */
	clean_limit = (env->me_flags & (MDB_NOMEMINIT|MDB_WRITEMAP))
		? SSIZE_MAX : maxfree_1pg;

	for (;;) {
		/* Come back here after each Put() in case freelist changed */
		MDB_val key, data;
		pgno_t *pgs;
		ssize_t j;

		/* If using records from freeDB which we have not yet
		 * deleted, delete them and any we reserved for me_pghead.
		 */
		while (pglast < env->me_pglast) {
			rc = mdb_cursor_first(&mc, &key, NULL);
			if (rc)
				return rc;
			pglast = head_id = *(txnid_t *)key.mv_data;
			total_room = head_room = 0;
			mdb_tassert(txn, pglast <= env->me_pglast);
			rc = mdb_cursor_del(&mc, 0);
			if (rc)
				return rc;
		}

		/* Save the IDL of pages freed by this txn, to a single record */
		if (freecnt < txn->mt_free_pgs[0]) {
			if (!freecnt) {
				/* Make sure last page of freeDB is touched and on freelist */
				rc = mdb_page_search(&mc, NULL, MDB_PS_LAST|MDB_PS_MODIFY);
				if (rc && rc != MDB_NOTFOUND)
					return rc;
			}
			free_pgs = txn->mt_free_pgs;
			/* Write to last page of freeDB */
			key.mv_size = sizeof(txn->mt_txnid);
			key.mv_data = &txn->mt_txnid;
			do {
				freecnt = free_pgs[0];
				data.mv_size = MDB_IDL_SIZEOF(free_pgs);
				rc = mdb_cursor_put(&mc, &key, &data, MDB_RESERVE);
				if (rc)
					return rc;
				/* Retry if mt_free_pgs[] grew during the Put() */
				free_pgs = txn->mt_free_pgs;
			} while (freecnt < free_pgs[0]);
			mdb_midl_sort(free_pgs);
			memcpy(data.mv_data, free_pgs, data.mv_size);
#if (MDB_DEBUG) > 1
			{
				unsigned int i = free_pgs[0];
				DPRINTF(("IDL write txn %"Y"u root %"Y"u num %u",
					txn->mt_txnid, txn->mt_dbs[FREE_DBI].md_root, i));
				for (; i; i--)
					DPRINTF(("IDL %"Y"u", free_pgs[i]));
			}
#endif
			continue;
		}

		mop = env->me_pghead;
		mop_len = (mop ? mop[0] : 0) + txn->mt_loose_count;

		/* Reserve records for me_pghead[]. Split it if multi-page,
		 * to avoid searching freeDB for a page range. Use keys in
		 * range [1,me_pglast]: Smaller than txnid of oldest reader.
		 */
		if (total_room >= mop_len) {
			if (total_room == mop_len || --more < 0)
				break;
		} else if (head_room >= maxfree_1pg && head_id > 1) {
			/* Keep current record (overflow page), add a new one */
			head_id--;
			head_room = 0;
		}
		/* (Re)write {key = head_id, IDL length = head_room} */
		total_room -= head_room;
		head_room = mop_len - total_room;
		if (head_room > maxfree_1pg && head_id > 1) {
			/* Overflow multi-page for part of me_pghead */
			head_room /= head_id; /* amortize page sizes */
			head_room += maxfree_1pg - head_room % (maxfree_1pg + 1);
		} else if (head_room < 0) {
			/* Rare case, not bothering to delete this record */
			head_room = 0;
		}
		key.mv_size = sizeof(head_id);
		key.mv_data = &head_id;
		data.mv_size = (head_room + 1) * sizeof(pgno_t);
		rc = mdb_cursor_put(&mc, &key, &data, MDB_RESERVE);
		if (rc)
			return rc;
		/* IDL is initially empty, zero out at least the length */
		pgs = (pgno_t *)data.mv_data;
		j = head_room > clean_limit ? head_room : 0;
		do {
			pgs[j] = 0;
		} while (--j >= 0);
		total_room += head_room;
	}

	/* Return loose page numbers to me_pghead, though usually none are
	 * left at this point.  The pages themselves remain in dirty_list.
	 */
	if (txn->mt_loose_pgs) {
		MDB_page *mp = txn->mt_loose_pgs;
		unsigned count = txn->mt_loose_count;
		MDB_IDL loose;
		/* Room for loose pages + temp IDL with same */
		if ((rc = mdb_midl_need(&env->me_pghead, 2*count+1)) != 0)
			return rc;
		mop = env->me_pghead;
		loose = mop + MDB_IDL_ALLOCLEN(mop) - count;
		for (count = 0; mp; mp = NEXT_LOOSE_PAGE(mp))
			loose[ ++count ] = mp->mp_pgno;
		loose[0] = count;
		mdb_midl_sort(loose);
		mdb_midl_xmerge(mop, loose);
		txn->mt_loose_pgs = NULL;
		txn->mt_loose_count = 0;
		mop_len = mop[0];
	}

	/* Fill in the reserved me_pghead records */
	rc = MDB_SUCCESS;
	if (mop_len) {
		MDB_val key, data;

		mop += mop_len;
		rc = mdb_cursor_first(&mc, &key, &data);
		for (; !rc; rc = mdb_cursor_next(&mc, &key, &data, MDB_NEXT)) {
			txnid_t id = *(txnid_t *)key.mv_data;
			ssize_t	len = (ssize_t)(data.mv_size / sizeof(MDB_ID)) - 1;
			MDB_ID save;

			mdb_tassert(txn, len >= 0 && id <= env->me_pglast);
			key.mv_data = &id;
			if (len > mop_len) {
				len = mop_len;
				data.mv_size = (len + 1) * sizeof(MDB_ID);
			}
			data.mv_data = mop -= len;
			save = mop[0];
			mop[0] = len;
			rc = mdb_cursor_put(&mc, &key, &data, MDB_CURRENT);
			mop[0] = save;
			if (rc || !(mop_len -= len))
				break;
		}
	}
	return rc;
}